

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O2

void __thiscall Centaurus::Stage1Runner::~Stage1Runner(Stage1Runner *this)

{
  (this->super_BaseRunner).super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__Stage1Runner_001b2208;
  BaseRunner::close_semaphore(&this->super_BaseRunner,true);
  BaseRunner::release_memory(&this->super_BaseRunner,true);
  std::
  _Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
  ::~_Vector_base(&(this->result_chunks_).
                   super__Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
                 );
  BaseRunner::~BaseRunner(&this->super_BaseRunner);
  return;
}

Assistant:

virtual ~Stage1Runner() {
    close_semaphore(true);
    release_memory(true);
  }